

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

void __thiscall google::protobuf::CEscapeAndAppend(protobuf *this,StringPiece src,string *dest)

{
  byte bVar1;
  long *plVar2;
  int i_1;
  int i;
  long lVar3;
  char *pcVar4;
  size_t escaped_len;
  char *pcVar5;
  byte *pbVar6;
  StringPiece local_50;
  StringPiece local_40;
  
  plVar2 = (long *)src.length_;
  pcVar4 = src.ptr_;
  pcVar5 = (char *)0x0;
  local_50.ptr_ = (char *)this;
  local_50.length_ = (stringpiece_ssize_type)pcVar4;
  local_40.ptr_ = (char *)this;
  local_40.length_ = (stringpiece_ssize_type)pcVar4;
  for (lVar3 = 0; lVar3 < local_40.length_; lVar3 = lVar3 + 1) {
    bVar1 = StringPiece::operator[](&local_40,lVar3);
    pcVar5 = pcVar5 + (char)CEscapedLength(google::protobuf::StringPiece)::c_escaped_len[bVar1];
  }
  if (pcVar5 == pcVar4) {
    std::__cxx11::string::append((char *)plVar2,(ulong)this);
  }
  else {
    lVar3 = plVar2[1];
    std::__cxx11::string::resize((ulong)plVar2);
    pbVar6 = (byte *)(lVar3 + *plVar2);
    for (lVar3 = 0; lVar3 < (long)pcVar4; lVar3 = lVar3 + 1) {
      bVar1 = StringPiece::operator[](&local_50,lVar3);
      if (bVar1 == 9) {
        pbVar6[0] = 0x5c;
        pbVar6[1] = 0x74;
LAB_002ce987:
        pbVar6 = pbVar6 + 2;
      }
      else {
        if (bVar1 == 0x5c) {
          pbVar6[0] = 0x5c;
          pbVar6[1] = 0x5c;
          goto LAB_002ce987;
        }
        if (bVar1 == 0xd) {
          pbVar6[0] = 0x5c;
          pbVar6[1] = 0x72;
          goto LAB_002ce987;
        }
        if (bVar1 == 0x22) {
          pbVar6[0] = 0x5c;
          pbVar6[1] = 0x22;
          goto LAB_002ce987;
        }
        if (bVar1 == 0x27) {
          pbVar6[0] = 0x5c;
          pbVar6[1] = 0x27;
          goto LAB_002ce987;
        }
        if (bVar1 == 10) {
          pbVar6[0] = 0x5c;
          pbVar6[1] = 0x6e;
          goto LAB_002ce987;
        }
        if ((byte)(bVar1 - 0x20) < 0x5f) {
          *pbVar6 = bVar1;
          pbVar6 = pbVar6 + 1;
        }
        else {
          *pbVar6 = 0x5c;
          pbVar6[1] = bVar1 >> 6 | 0x30;
          pbVar6[2] = bVar1 >> 3 & 7 | 0x30;
          pbVar6[3] = bVar1 & 7 | 0x30;
          pbVar6 = pbVar6 + 4;
        }
      }
      pcVar4 = (char *)local_50.length_;
    }
  }
  return;
}

Assistant:

void CEscapeAndAppend(StringPiece src, string* dest) {
  size_t escaped_len = CEscapedLength(src);
  if (escaped_len == src.size()) {
    dest->append(src.data(), src.size());
    return;
  }

  size_t cur_dest_len = dest->size();
  dest->resize(cur_dest_len + escaped_len);
  char* append_ptr = &(*dest)[cur_dest_len];

  for (int i = 0; i < src.size(); ++i) {
    unsigned char c = static_cast<unsigned char>(src[i]);
    switch (c) {
      case '\n': *append_ptr++ = '\\'; *append_ptr++ = 'n'; break;
      case '\r': *append_ptr++ = '\\'; *append_ptr++ = 'r'; break;
      case '\t': *append_ptr++ = '\\'; *append_ptr++ = 't'; break;
      case '\"': *append_ptr++ = '\\'; *append_ptr++ = '\"'; break;
      case '\'': *append_ptr++ = '\\'; *append_ptr++ = '\''; break;
      case '\\': *append_ptr++ = '\\'; *append_ptr++ = '\\'; break;
      default:
        if (!isprint(c)) {
          *append_ptr++ = '\\';
          *append_ptr++ = '0' + c / 64;
          *append_ptr++ = '0' + (c % 64) / 8;
          *append_ptr++ = '0' + c % 8;
        } else {
          *append_ptr++ = c;
        }
        break;
    }
  }
}